

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# craigtracer.cpp
# Opt level: O2

CraigCnfType __thiscall
CaDiCraig::CraigTracer::create_craig_interpolant
          (CraigTracer *this,CraigInterpolant interpolant,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *cnf,int *nextFreeVariable)

{
  CraigConstruction CVar1;
  uint uVar2;
  int *piVar3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar4;
  pointer pvVar5;
  CraigConstruction CVar6;
  byte bVar7;
  byte bVar8;
  CraigCnfType CVar9;
  uint *puVar10;
  char *pcVar11;
  undefined1 *puVar12;
  long lVar13;
  bool bVar14;
  long lVar15;
  uint *nextFreeIndex;
  pointer ptVar16;
  byte bVar18;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *extraout_RDX;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar17;
  byte bVar19;
  long lVar20;
  tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
  *it_1;
  pointer ptVar21;
  ulong uVar22;
  CraigData *root;
  Aig *this_00;
  _Vector_base<std::tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>,_std::allocator<std::tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>_>_>
  *this_01;
  CraigCnfType unaff_R13B;
  char unaff_R14B;
  tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
  *it;
  CraigCnfType unaff_R15B;
  pointer ptVar23;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  allocator_type local_119;
  uint *local_118;
  uint local_10c;
  _Vector_base<std::tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>,_std::allocator<std::tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>_>_>
  local_108;
  _Vector_base<int,_std::allocator<int>_> local_f0;
  vector<int,_std::allocator<int>_> craig_trigger_clause;
  CraigCnfType local_b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  craig_cnf_dual_sym;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  craig_cnf_dual_asym;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  craig_cnf_asym;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  craig_cnf_sym;
  
  this_00 = (Aig *)cnf;
  local_118 = (uint *)nextFreeVariable;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(cnf);
  root = this->craig_interpolant;
  if (root == (CraigData *)0x0) {
    return NONE;
  }
  puVar10 = &switchD_006305a1::switchdataD_00766ca0;
  lVar15 = (long)(int)(&switchD_006305a1::switchdataD_00766ca0)[interpolant];
  nextFreeIndex = (uint *)((long)&switchD_006305a1::switchdataD_00766ca0 + lVar15);
  CVar9 = local_b8;
  switch(nextFreeIndex) {
  case (uint *)0x6305a3:
    CVar1 = this->craig_construction;
    CVar6 = CVar1 & SYMMETRIC;
    bVar8 = (CVar1 & ASYMMETRIC) >> 1;
    bVar7 = (CVar1 & DUAL_SYMMETRIC) >> 2;
    bVar19 = (CVar1 & DUAL_ASYMMETRIC) >> 3;
    break;
  case (uint *)0x6305d4:
    bVar19 = (this->craig_construction & DUAL_ASYMMETRIC) >> 3;
LAB_00630610:
    bVar7 = 0;
LAB_00630613:
    bVar8 = 0;
LAB_00630616:
    CVar6 = NONE;
    break;
  case (uint *)0x6305e4:
    bVar8 = (this->craig_construction & ASYMMETRIC) >> 1;
    bVar19 = 0;
    bVar7 = 0;
    goto LAB_00630616;
  case (uint *)0x6305fa:
    bVar7 = (this->craig_construction & DUAL_SYMMETRIC) >> 2;
    bVar19 = 0;
    goto LAB_00630613;
  case (uint *)0x63060e:
    bVar19 = 0;
    goto LAB_00630610;
  case (uint *)0x630713:
    pvVar17 = extraout_RDX;
    goto code_r0x00630716;
  case (uint *)0x630718:
    out(0xff,0x766ca0);
    *(int *)("% SZS output end FiniteModel for " + lVar15 + 0x14) =
         *(int *)("% SZS output end FiniteModel for " + lVar15 + 0x14) + 1;
    halt_baddata();
  case (uint *)0x63074a:
    halt_baddata();
  case (uint *)0x630760:
    this_01 = (_Vector_base<std::tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>,_std::allocator<std::tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>_>_>
               *)((ulong)&local_108 & 0xffffffff);
    goto code_r0x00630764;
  case (uint *)0x630786:
    DAT_00766c80 = 0x81;
    uVar2 = *nextFreeIndex;
    bVar18 = (byte)((ulong)extraout_RDX >> 8);
    *(byte *)nextFreeIndex = (byte)*nextFreeIndex + bVar18;
    bVar7 = (byte)(0x6c80 / (byte)*nextFreeIndex);
    bVar19 = (byte)nextFreeIndex & 0x1f;
    bVar8 = bVar7 >> bVar19;
    bVar14 = ((ulong)nextFreeIndex & 0x1f) != 0;
    pcVar11 = (char *)(CONCAT71((int7)(CONCAT62(0x76,CONCAT11((char)(0x6c80 % (ushort)(byte)*
                                                  nextFreeIndex),bVar7)) >> 8),bVar8) * 2);
    *pcVar11 = *pcVar11 + (byte)nextFreeIndex +
               (!bVar14 && CARRY1((byte)uVar2,bVar18) || bVar14 && (bVar7 >> bVar19 - 1 & 1) != 0);
    "N3Lib13ProxyIteratorIPN6Kernel4UnitENS_4ListIS3_E8IteratorEEE"[lVar15 + 0x15] =
         "N3Lib13ProxyIteratorIPN6Kernel4UnitENS_4ListIS3_E8IteratorEEE"[lVar15 + 0x15] + bVar8;
    LOCK();
    *(int *)&this_00[0x878787].varHashMap._M_h._M_single_bucket = (int)nextFreeIndex;
    UNLOCK();
    goto code_r0x006307a5;
  case (uint *)0x63079b:
    goto switchD_006305a1_caseD_63079b;
  case (uint *)0x6307b4:
    goto switchD_006305a1_caseD_6307b4;
  case (uint *)0x6307d1:
    pcVar11 = (char *)CONCAT62(0x76,CONCAT11(0x3d,DAT_e8243c8b48000000));
    *pcVar11 = *pcVar11 + DAT_e8243c8b48000000;
    goto code_r0x006307e0;
  case (uint *)0x6307ea:
    goto switchD_006305a1_caseD_6307ea;
  case (uint *)0x630906:
    CVar6 = this->craig_construction & SYMMETRIC;
    bVar19 = 0;
    bVar7 = 0;
    bVar8 = 0;
  }
  craig_cnf_sym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  craig_cnf_sym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  craig_cnf_sym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  craig_cnf_asym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  craig_cnf_asym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  craig_cnf_asym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  craig_cnf_dual_sym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  craig_cnf_dual_sym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  craig_cnf_dual_sym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  craig_cnf_dual_asym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  craig_cnf_dual_asym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  craig_cnf_dual_asym.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CVar6 == NONE) {
    unaff_R15B = NONE;
  }
  else {
    unaff_R15B = Aig::create_cnf(this->craig_aig_sym,&root->partial_interpolant_sym,&craig_cnf_sym,
                                 (int *)local_118);
  }
  if (bVar8 == 0) {
    local_b8 = NONE;
  }
  else {
    local_b8 = Aig::create_cnf(this->craig_aig_asym,
                               &this->craig_interpolant->partial_interpolant_asym,&craig_cnf_asym,
                               (int *)local_118);
  }
  if (bVar7 == 0) {
    unaff_R13B = NONE;
  }
  else {
    unaff_R13B = Aig::create_cnf(this->craig_aig_dual_sym,
                                 &this->craig_interpolant->partial_interpolant_dual_sym,
                                 &craig_cnf_dual_sym,(int *)local_118);
  }
  if (bVar19 == 0) {
    this = (CraigTracer *)0x0;
  }
  else {
    this_00 = this->craig_aig_dual_asym;
    root = (CraigData *)&this->craig_interpolant->partial_interpolant_dual_asym;
    pvVar17 = &craig_cnf_dual_asym;
    nextFreeIndex = local_118;
code_r0x00630716:
    CVar9 = Aig::create_cnf(this_00,&root->partial_interpolant_sym,pvVar17,(int *)nextFreeIndex);
    this = (CraigTracer *)(ulong)CVar9;
  }
  nextFreeIndex = &switchD_00630735::switchdataD_00766cc4;
  puVar10 = (uint *)((long)&switchD_00630735::switchdataD_00766cc4 +
                    (long)(int)(&switchD_00630735::switchdataD_00766cc4)[unaff_R13B]);
  switch(puVar10) {
  case (uint *)0x630737:
    unaff_R14B = '\x01';
    goto switchD_006305a1_caseD_63079b;
  case (uint *)0x63073c:
    local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::_M_assign_aux<std::vector<int,std::allocator<int>>const*>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&craig_cnf_dual_sym);
    this_01 = &local_108;
code_r0x00630764:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)this_01);
    unaff_R13B = CONSTANT0;
    goto LAB_0063077f;
  case (uint *)0x63076e:
    piVar3 = craig_cnf_dual_sym.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    *piVar3 = -*piVar3;
    unaff_R13B = NORMAL;
LAB_0063077f:
    unaff_R14B = '\0';
switchD_006305a1_caseD_63079b:
    if (interpolant < INTERSECTION) {
code_r0x006307a5:
      CVar9 = (*(code *)((long)&UINT_00766cd4 + (long)(int)(&UINT_00766cd4)[interpolant]))();
      return CVar9;
    }
    local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (unaff_R15B != NONE) {
      craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,unaff_R15B);
      craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&craig_cnf_sym;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&local_108,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&craig_trigger_clause);
    }
    if (local_b8 != NONE) {
      craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,local_b8);
      craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&craig_cnf_asym;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&local_108,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&craig_trigger_clause);
    }
    if (unaff_R14B == '\0') {
      craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,unaff_R13B);
      craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&craig_cnf_dual_sym;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&local_108,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&craig_trigger_clause);
    }
    if ((char)this != '\0') {
      craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,(char)this);
      craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&craig_cnf_dual_asym;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&local_108,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&craig_trigger_clause);
    }
    lVar15 = (long)local_108._M_impl.super__Vector_impl_data._M_finish -
             (long)local_108._M_impl.super__Vector_impl_data._M_start >> 4;
    if (lVar15 == 0) {
      unaff_R13B = NONE;
    }
    else if (lVar15 == 1) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::_M_move_assign(cnf,((local_108._M_impl.super__Vector_impl_data._M_start)->
                           super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                           ).
                           super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                           ._M_head_impl);
      unaff_R13B = ((local_108._M_impl.super__Vector_impl_data._M_start)->
                   super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                   ).super__Tuple_impl<1UL,_CaDiCraig::CraigCnfType>.
                   super__Head_base<1UL,_CaDiCraig::CraigCnfType,_false>._M_head_impl;
    }
    else {
      ptVar23 = local_108._M_impl.super__Vector_impl_data._M_start;
      if (interpolant == SMALLEST) {
        ptVar16 = local_108._M_impl.super__Vector_impl_data._M_start;
        ptVar21 = local_108._M_impl.super__Vector_impl_data._M_start;
        if (local_108._M_impl.super__Vector_impl_data._M_start !=
            local_108._M_impl.super__Vector_impl_data._M_finish) {
          while (ptVar23 = ptVar16, ptVar16 = ptVar21 + 1,
                ptVar16 != local_108._M_impl.super__Vector_impl_data._M_finish) {
            pvVar17 = ptVar21[1].
                      super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                      .
                      super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                      ._M_head_impl;
            pvVar4 = (ptVar23->
                     super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                     ).
                     super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                     ._M_head_impl;
            ptVar21 = ptVar16;
            if ((ulong)((long)(pvVar4->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar4->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) <=
                (ulong)((long)(pvVar17->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar17->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)) {
              ptVar16 = ptVar23;
            }
          }
        }
LAB_00630a02:
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::_M_move_assign(cnf,(ptVar23->
                             super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                             ).
                             super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                             ._M_head_impl);
        unaff_R13B = (ptVar23->
                     super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                     ).super__Tuple_impl<1UL,_CaDiCraig::CraigCnfType>.
                     super__Head_base<1UL,_CaDiCraig::CraigCnfType,_false>._M_head_impl;
      }
      else if (interpolant == UNION) {
        bVar14 = true;
        for (; ptVar23 != local_108._M_impl.super__Vector_impl_data._M_finish; ptVar23 = ptVar23 + 1
            ) {
          CVar9 = (ptVar23->
                  super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  ).super__Tuple_impl<1UL,_CaDiCraig::CraigCnfType>.
                  super__Head_base<1UL,_CaDiCraig::CraigCnfType,_false>._M_head_impl;
          if (CVar9 == CONSTANT0) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::_M_move_assign(cnf,(ptVar23->
                                 super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                                 ).
                                 super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                                 ._M_head_impl);
            goto LAB_00630a72;
          }
          bVar14 = bVar14 && CVar9 == CONSTANT1;
        }
        if (bVar14) {
          unaff_R13B = CONSTANT1;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator=(cnf,(initializer_list<std::vector<int,_std::allocator<int>_>_>)ZEXT816(0));
        }
        else {
          uVar2 = *local_118;
          *local_118 = uVar2 + 1;
          __l._M_len = 1;
          __l._M_array = (iterator)&local_f0;
          local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar2;
          std::vector<int,_std::allocator<int>_>::vector
                    (&craig_trigger_clause,__l,(allocator_type *)&local_10c);
          ptVar23 = local_108._M_impl.super__Vector_impl_data._M_finish;
          local_118 = (uint *)CONCAT44(local_118._4_4_,-uVar2);
          for (ptVar21 = local_108._M_impl.super__Vector_impl_data._M_start; ptVar21 != ptVar23;
              ptVar21 = ptVar21 + 1) {
            if ((ptVar21->
                super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                ).super__Tuple_impl<1UL,_CaDiCraig::CraigCnfType>.
                super__Head_base<1UL,_CaDiCraig::CraigCnfType,_false>._M_head_impl == NORMAL) {
              lVar15 = ((long)(cnf->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(cnf->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x18;
              pvVar17 = (ptVar21->
                        super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                        ).
                        super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                        ._M_head_impl;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::resize(cnf,((long)(pvVar17->
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar17->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) / 0x18 + lVar15);
              lVar15 = lVar15 * 0x18;
              lVar20 = 0;
              uVar22 = 0;
              while( true ) {
                pvVar17 = (ptVar21->
                          super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                          ).
                          super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                          ._M_head_impl;
                pvVar5 = (pvVar17->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                lVar13 = (long)(pvVar17->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5;
                if (lVar13 / 0x18 - 1U <= uVar22) break;
                std::vector<int,_std::allocator<int>_>::_M_move_assign
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(((cnf->
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + lVar15),
                           (long)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + lVar20,lVar13 % 0x18);
                uVar22 = uVar22 + 1;
                lVar15 = lVar15 + 0x18;
                lVar20 = lVar20 + 0x18;
              }
              local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ = local_118._0_4_;
              local_f0._M_impl.super__Vector_impl_data._M_start._4_4_ =
                   **(int **)((long)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data + lVar20);
              std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                        ((vector<int,std::allocator<int>> *)
                         ((long)&(((cnf->
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + lVar15),&local_f0,
                         &local_f0._M_impl.super__Vector_impl_data._M_finish);
              local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ =
                   -**(int **)((long)&(((((ptVar21->
                                          super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                                          ).
                                          super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                                         ._M_head_impl)->
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data + lVar20);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        (&craig_trigger_clause,(int *)&local_f0);
            }
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(cnf,&craig_trigger_clause);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_10c;
          local_10c = uVar2;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_f0,__l_01,&local_119);
          std::
          vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
          ::emplace_back<std::vector<int,std::allocator<int>>>
                    ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                      *)cnf,(vector<int,_std::allocator<int>_> *)&local_f0);
LAB_00630d33:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f0);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>);
          unaff_R13B = NORMAL;
        }
      }
      else {
        if (interpolant != INTERSECTION) {
          ptVar16 = local_108._M_impl.super__Vector_impl_data._M_start;
          ptVar21 = local_108._M_impl.super__Vector_impl_data._M_start;
          if (local_108._M_impl.super__Vector_impl_data._M_start !=
              local_108._M_impl.super__Vector_impl_data._M_finish) {
            while (ptVar23 = ptVar16, ptVar16 = ptVar21 + 1,
                  ptVar16 != local_108._M_impl.super__Vector_impl_data._M_finish) {
              pvVar17 = (ptVar23->
                        super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                        ).
                        super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                        ._M_head_impl;
              pvVar4 = ptVar21[1].
                       super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                       .
                       super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                       ._M_head_impl;
              ptVar21 = ptVar16;
              if ((ulong)((long)(pvVar4->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar4->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) <=
                  (ulong)((long)(pvVar17->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar17->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)) {
                ptVar16 = ptVar23;
              }
            }
          }
          goto LAB_00630a02;
        }
        bVar14 = true;
        for (; ptVar23 != local_108._M_impl.super__Vector_impl_data._M_finish; ptVar23 = ptVar23 + 1
            ) {
          CVar9 = (ptVar23->
                  super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  ).super__Tuple_impl<1UL,_CaDiCraig::CraigCnfType>.
                  super__Head_base<1UL,_CaDiCraig::CraigCnfType,_false>._M_head_impl;
          if (CVar9 == CONSTANT1) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::_M_move_assign(cnf,(ptVar23->
                                 super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                                 ).
                                 super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                                 ._M_head_impl);
            unaff_R13B = CONSTANT1;
            goto LAB_00630d4a;
          }
          bVar14 = bVar14 && CVar9 == CONSTANT0;
        }
        if (!bVar14) {
          uVar2 = *local_118;
          *local_118 = uVar2 + 1;
          local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ = -uVar2;
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&local_f0;
          local_118 = (uint *)(ulong)uVar2;
          std::vector<int,_std::allocator<int>_>::vector
                    (&craig_trigger_clause,__l_00,(allocator_type *)&local_10c);
          ptVar23 = local_108._M_impl.super__Vector_impl_data._M_finish;
          for (ptVar21 = local_108._M_impl.super__Vector_impl_data._M_start; ptVar21 != ptVar23;
              ptVar21 = ptVar21 + 1) {
            if ((ptVar21->
                super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                ).super__Tuple_impl<1UL,_CaDiCraig::CraigCnfType>.
                super__Head_base<1UL,_CaDiCraig::CraigCnfType,_false>._M_head_impl == NORMAL) {
              lVar15 = ((long)(cnf->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(cnf->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x18;
              pvVar17 = (ptVar21->
                        super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                        ).
                        super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                        ._M_head_impl;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::resize(cnf,((long)(pvVar17->
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar17->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) / 0x18 + lVar15);
              lVar20 = 0;
              uVar22 = 0;
              while( true ) {
                pvVar17 = (ptVar21->
                          super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                          ).
                          super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                          ._M_head_impl;
                pvVar5 = (pvVar17->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                lVar13 = (long)(pvVar17->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5;
                if (lVar13 / 0x18 - 1U <= uVar22) break;
                std::vector<int,_std::allocator<int>_>::_M_move_assign
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(cnf->
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar15].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + lVar20),
                           (long)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + lVar20,lVar13 % 0x18);
                uVar22 = uVar22 + 1;
                lVar20 = lVar20 + 0x18;
              }
              std::vector<int,_std::allocator<int>_>::push_back
                        (&craig_trigger_clause,
                         *(value_type_conflict3 **)
                          ((long)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + lVar20));
              local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)local_118;
              local_f0._M_impl.super__Vector_impl_data._M_start._4_4_ =
                   -**(int **)((long)&(((((ptVar21->
                                          super__Tuple_impl<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                                          ).
                                          super__Head_base<0UL,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
                                         ._M_head_impl)->
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data + lVar20);
              std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                        ((vector<int,std::allocator<int>> *)
                         ((long)&(cnf->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[lVar15].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + lVar20),&local_f0,
                         &local_f0._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(cnf,&craig_trigger_clause);
          local_10c = (uint)local_118;
          __l_02._M_len = 1;
          __l_02._M_array = (iterator)&local_10c;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_f0,__l_02,&local_119);
          std::
          vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
          ::emplace_back<std::vector<int,std::allocator<int>>>
                    ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                      *)cnf,(vector<int,_std::allocator<int>_> *)&local_f0);
          goto LAB_00630d33;
        }
        craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::_M_assign_aux<std::vector<int,std::allocator<int>>const*>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)cnf,&craig_trigger_clause);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&craig_trigger_clause.super__Vector_base<int,_std::allocator<int>_>);
LAB_00630a72:
        unaff_R13B = CONSTANT0;
      }
    }
LAB_00630d4a:
    std::
    _Vector_base<std::tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>,_std::allocator<std::tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>_>_>
    ::~_Vector_base(&local_108);
    break;
  case (uint *)0x630784:
    unaff_R14B = '\0';
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=(&craig_cnf_dual_sym,
                (initializer_list<std::vector<int,_std::allocator<int>_>_>)ZEXT816(0));
    unaff_R13B = CONSTANT1;
    goto switchD_006305a1_caseD_63079b;
  case (uint *)0x6307aa:
    goto code_r0x006307a5;
  case (uint *)0x6307bf:
switchD_006305a1_caseD_6307b4:
    *(char *)((long)puVar10 + 1) = (char)nextFreeIndex;
    unaff_R13B = NONE;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=(cnf,(initializer_list<std::vector<int,_std::allocator<int>_>_>)ZEXT816(0));
    break;
  case (uint *)0x6307d8:
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::_M_move_assign((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)((ulong)cnf & 0xffffffff));
code_r0x006307e0:
    unaff_R13B = (CraigCnfType)this;
    break;
  case (uint *)0x6307f6:
    puVar10 = (uint *)((ulong)puVar10 & 0xffffffffffffff70);
    CVar9 = local_b8;
switchD_006305a1_caseD_6307ea:
    unaff_R13B = CVar9;
    puVar12 = (undefined1 *)CONCAT62((int6)((ulong)puVar10 >> 0x10),CONCAT11(0x24,(char)puVar10));
    *puVar12 = *puVar12;
    puVar12[-0x75] = puVar12[-0x75] + (char)nextFreeIndex;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::_M_move_assign();
    break;
  case (uint *)0x63080e:
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::_M_move_assign((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)((ulong)cnf & 0xffffffff));
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&craig_cnf_dual_asym);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&craig_cnf_dual_sym);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&craig_cnf_asym);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&craig_cnf_sym);
  return unaff_R13B;
}

Assistant:

CraigCnfType
CraigTracer::create_craig_interpolant (CraigInterpolant interpolant,
                                       std::vector<std::vector<int>> &cnf,
                                       int &nextFreeVariable) {
  cnf.clear ();

  if (!has_craig_interpolant ()) {
    return CraigCnfType::NONE;
  }

  bool build_cnf_sym = false;
  bool build_cnf_asym = false;
  bool build_cnf_dual_sym = false;
  bool build_cnf_dual_asym = false;
  switch (interpolant) {
  case CraigInterpolant::NONE:
    break;
  case CraigInterpolant::SYMMETRIC:
    build_cnf_sym = is_construction_enabled (CraigConstruction::SYMMETRIC);
    break;
  case CraigInterpolant::ASYMMETRIC:
    build_cnf_asym =
        is_construction_enabled (CraigConstruction::ASYMMETRIC);
    break;
  case CraigInterpolant::DUAL_SYMMETRIC:
    build_cnf_dual_sym =
        is_construction_enabled (CraigConstruction::DUAL_SYMMETRIC);
    break;
  case CraigInterpolant::DUAL_ASYMMETRIC:
    build_cnf_dual_asym =
        is_construction_enabled (CraigConstruction::DUAL_ASYMMETRIC);
    break;
  case CraigInterpolant::INTERSECTION:
  case CraigInterpolant::UNION:
  case CraigInterpolant::SMALLEST:
  case CraigInterpolant::LARGEST:
    build_cnf_sym = is_construction_enabled (CraigConstruction::SYMMETRIC);
    build_cnf_asym =
        is_construction_enabled (CraigConstruction::ASYMMETRIC);
    build_cnf_dual_sym =
        is_construction_enabled (CraigConstruction::DUAL_SYMMETRIC);
    build_cnf_dual_asym =
        is_construction_enabled (CraigConstruction::DUAL_ASYMMETRIC);
    break;

  default:
    assert (false); // Seleted craig interpolation type not supported!
    __builtin_unreachable ();
  }

  std::vector<std::vector<int>> craig_cnf_sym;
  std::vector<std::vector<int>> craig_cnf_asym;
  std::vector<std::vector<int>> craig_cnf_dual_sym;
  std::vector<std::vector<int>> craig_cnf_dual_asym;
  CraigCnfType craig_cnf_type_sym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_asym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_dual_sym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_dual_asym = CraigCnfType::NONE;

  if (build_cnf_sym)
    craig_cnf_type_sym = craig_aig_sym->create_cnf (
        craig_interpolant->partial_interpolant_sym, craig_cnf_sym,
        nextFreeVariable);
  if (build_cnf_asym)
    craig_cnf_type_asym = craig_aig_asym->create_cnf (
        craig_interpolant->partial_interpolant_asym, craig_cnf_asym,
        nextFreeVariable);
  if (build_cnf_dual_sym)
    craig_cnf_type_dual_sym = craig_aig_dual_sym->create_cnf (
        craig_interpolant->partial_interpolant_dual_sym, craig_cnf_dual_sym,
        nextFreeVariable);
  if (build_cnf_dual_asym)
    craig_cnf_type_dual_asym = craig_aig_dual_asym->create_cnf (
        craig_interpolant->partial_interpolant_dual_asym,
        craig_cnf_dual_asym, nextFreeVariable);

  // Dual Craig interpolants have to be inverted.
  // However, the construction rules for the dual asymmetric interpolant
  // already incorporates the negation. So only the dual symmetric
  // interpolant needs to be negated.
  if (craig_cnf_type_dual_sym == CraigCnfType::CONSTANT1) {
    craig_cnf_dual_sym = {{}};
    craig_cnf_type_dual_sym = CraigCnfType::CONSTANT0;
  } else if (craig_cnf_type_dual_sym == CraigCnfType::CONSTANT0) {
    craig_cnf_dual_sym = {};
    craig_cnf_type_dual_sym = CraigCnfType::CONSTANT1;
  } else if (craig_cnf_type_dual_sym == CraigCnfType::NORMAL) {
    craig_cnf_dual_sym.back ()[0] = -craig_cnf_dual_sym.back ()[0];
  }

  if (interpolant == CraigInterpolant::NONE) {
    cnf = {};
    return CraigCnfType::NONE;
  } else if (interpolant == CraigInterpolant::SYMMETRIC) {
    cnf = std::move (craig_cnf_sym);
    return craig_cnf_type_sym;
  } else if (interpolant == CraigInterpolant::ASYMMETRIC) {
    cnf = std::move (craig_cnf_asym);
    return craig_cnf_type_asym;
  } else if (interpolant == CraigInterpolant::DUAL_SYMMETRIC) {
    cnf = std::move (craig_cnf_dual_sym);
    return craig_cnf_type_dual_sym;
  } else if (interpolant == CraigInterpolant::DUAL_ASYMMETRIC) {
    cnf = std::move (craig_cnf_dual_asym);
    return craig_cnf_type_dual_asym;
  }

  std::vector<std::tuple<std::vector<std::vector<int>> *, CraigCnfType>>
      craig_cnfs{};
  if (craig_cnf_type_sym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_sym, craig_cnf_type_sym});
  if (craig_cnf_type_asym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_asym, craig_cnf_type_asym});
  if (craig_cnf_type_dual_sym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_dual_sym, craig_cnf_type_dual_sym});
  if (craig_cnf_type_dual_asym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_dual_asym, craig_cnf_type_dual_asym});

  if (craig_cnfs.size () == 0) {
    return CraigCnfType::NONE;
  } else if (craig_cnfs.size () == 1) {
    cnf = std::move (*std::get<0> (craig_cnfs[0]));
    return std::get<1> (craig_cnfs[0]);
  }

  // We have at least two Craig interpolants for the following computations.
  if (interpolant == CraigInterpolant::UNION) {
    bool allConstantOne = true;
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::CONSTANT0) {
        cnf = std::move (*std::get<0> (it));
        return CraigCnfType::CONSTANT0;
      }
      allConstantOne &= (std::get<1> (it) == CraigCnfType::CONSTANT1);
    }
    if (allConstantOne) {
      cnf = {};
      return CraigCnfType::CONSTANT1;
    }

    // Create trigger (t) that enforces all CNF parts.
    int craig_trigger = nextFreeVariable++;
    std::vector<int> craig_trigger_clause{craig_trigger};
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::NORMAL) {
        size_t i = 0, j = cnf.size ();
        cnf.resize (cnf.size () + std::get<0> (it)->size ());
        for (; i < std::get<0> (it)->size () - 1u; i++, j++)
          cnf[j] = std::move ((*std::get<0> (it))[i]);
        // The positive trigger implies that all CNF parts are enabled: (t
        // -> t_1) = (-t v t_1)
        cnf[j] = {-craig_trigger, (*std::get<0> (it))[i][0]};
        // The negative trigger implies that at least one of the CNF parts
        // is not enabled: (-t -> (-t_1 v ... v -t_n)) = (t v -t_1 v ...
        // -t_n)
        craig_trigger_clause.push_back (-(*std::get<0> (it))[i][0]);
      }
    }

    cnf.push_back (craig_trigger_clause);
    cnf.push_back ({craig_trigger});

    return CraigCnfType::NORMAL;
  } else if (interpolant == CraigInterpolant::INTERSECTION) {
    bool allConstantZero = true;
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::CONSTANT1) {
        cnf = std::move (*std::get<0> (it));
        return CraigCnfType::CONSTANT1;
      }
      allConstantZero &= (std::get<1> (it) == CraigCnfType::CONSTANT0);
    }
    if (allConstantZero) {
      cnf = {{}};
      return CraigCnfType::CONSTANT0;
    }

    // Create trigger (t) that enforces all CNF parts.
    int craig_trigger = nextFreeVariable++;
    std::vector<int> craig_trigger_clause{-craig_trigger};
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::NORMAL) {
        size_t i = 0, j = cnf.size ();
        cnf.resize (cnf.size () + std::get<0> (it)->size ());
        for (; i < std::get<0> (it)->size () - 1u; i++, j++)
          cnf[j] = std::move ((*std::get<0> (it))[i]);
        // The positive trigger implies that one of the CNF parts is
        // enabled: (t -> (t_1 v ... v t_n)) = (-t v t_1 v ... t_n)
        craig_trigger_clause.push_back ((*std::get<0> (it))[i][0]);
        // The negative trigger implies that at all CNF parts are not
        // enabled: (-t -> -t_1) = (t v -t_1)
        cnf[j] = {craig_trigger, -(*std::get<0> (it))[i][0]};
      }
    }

    cnf.push_back (craig_trigger_clause);
    cnf.push_back ({craig_trigger});

    return CraigCnfType::NORMAL;
  } else if (interpolant == CraigInterpolant::SMALLEST) {
    auto compare = [] (const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem1,
                       const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem2) {
      return (std::get<0> (elem1)->size () < std::get<0> (elem2)->size ());
    };
    auto minimum =
        std::min_element (craig_cnfs.begin (), craig_cnfs.end (), compare);
    cnf = std::move (*std::get<0> (*minimum));
    return std::get<1> (*minimum);
  } else if (interpolant == CraigInterpolant::LARGEST) {
    auto compare = [] (const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem1,
                       const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem2) {
      return (std::get<0> (elem1)->size () < std::get<0> (elem2)->size ());
    };
    auto maximum =
        std::max_element (craig_cnfs.begin (), craig_cnfs.end (), compare);
    cnf = std::move (*std::get<0> (*maximum));
    return std::get<1> (*maximum);
  } else {
    assert (false); // Seleted craig interpolation type not supported!
    __builtin_unreachable ();
  }
}